

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,QueryNode *node)

{
  QueryNodeType QVar1;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var2;
  undefined1 auVar3 [8];
  bool bVar4;
  CTENode *statement;
  pointer pBVar5;
  RecursiveCTENode *statement_00;
  SelectNode *statement_01;
  SetOperationNode *statement_02;
  undefined1 local_58 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_50;
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if ((((node->type != CTE_NODE) &&
       (bVar4 = Optimizer::OptimizerDisabled(this->context,MATERIALIZED_CTE), !bVar4)) &&
      ((this->context->config).enable_optimizer == true)) &&
     (bVar4 = OptimizeCTEs(this,node), bVar4)) {
    QVar1 = node->type;
    if (QVar1 == SELECT_NODE) {
      statement_01 = QueryNode::Cast<duckdb::SelectNode>(node);
      BindWithCTE<duckdb::SelectNode>((BoundStatement *)&stack0xffffffffffffffb0,this,statement_01);
    }
    else if (QVar1 == RECURSIVE_CTE_NODE) {
      statement_00 = QueryNode::Cast<duckdb::RecursiveCTENode>(node);
      BindWithCTE<duckdb::RecursiveCTENode>
                ((BoundStatement *)&stack0xffffffffffffffb0,this,statement_00);
    }
    else if (QVar1 == CTE_NODE) {
      statement = QueryNode::Cast<duckdb::CTENode>(node);
      BindWithCTE<duckdb::CTENode>((BoundStatement *)&stack0xffffffffffffffb0,this,statement);
    }
    else {
      statement_02 = QueryNode::Cast<duckdb::SetOperationNode>(node);
      BindWithCTE<duckdb::SetOperationNode>
                ((BoundStatement *)&stack0xffffffffffffffb0,this,statement_02);
    }
    BoundStatement::operator=(__return_storage_ptr__,(BoundStatement *)&stack0xffffffffffffffb0);
    BoundStatement::~BoundStatement((BoundStatement *)&stack0xffffffffffffffb0);
    return __return_storage_ptr__;
  }
  BindNode((Binder *)&stack0xffffffffffffffb0,(QueryNode *)this);
  pBVar5 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                       *)&stack0xffffffffffffffb0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__return_storage_ptr__->names,
              &(pBVar5->names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  pBVar5 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
           operator->((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
                       *)&stack0xffffffffffffffb0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(__return_storage_ptr__->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &(pBVar5->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)&stack0xffffffffffffffb0);
  CreatePlan((Binder *)local_58,(BoundQueryNode *)this);
  auVar3 = local_58;
  local_58 = (undefined1  [8])0x0;
  _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (__return_storage_ptr__->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)auVar3;
  if ((_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
       (LogicalOperator *)0x0) &&
     ((**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))(), local_58 != (undefined1  [8])0x0)) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_58)->__weak_this_).internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(local_50._M_pi)->_vptr__Sp_counted_base[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(QueryNode &node) {
	BoundStatement result;
	if (node.type != QueryNodeType::CTE_NODE && // Issue #13850 - Don't auto-materialize if users materialize (for now)
	    !Optimizer::OptimizerDisabled(context, OptimizerType::MATERIALIZED_CTE) && context.config.enable_optimizer &&
	    OptimizeCTEs(node)) {
		switch (node.type) {
		case QueryNodeType::SELECT_NODE:
			result = BindWithCTE(node.Cast<SelectNode>());
			break;
		case QueryNodeType::RECURSIVE_CTE_NODE:
			result = BindWithCTE(node.Cast<RecursiveCTENode>());
			break;
		case QueryNodeType::CTE_NODE:
			result = BindWithCTE(node.Cast<CTENode>());
			break;
		default:
			D_ASSERT(node.type == QueryNodeType::SET_OPERATION_NODE);
			result = BindWithCTE(node.Cast<SetOperationNode>());
			break;
		}
	} else {
		auto bound_node = BindNode(node);

		result.names = bound_node->names;
		result.types = bound_node->types;

		// and plan it
		result.plan = CreatePlan(*bound_node);
	}
	return result;
}